

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O3

int __thiscall Fl_Text_Editor::handle_key(Fl_Text_Editor *this)

{
  uint *puVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Key_Binding *cur;
  Key_Binding *pKVar5;
  Key_Func p_Var6;
  uint __nfds;
  fd_set *in_R8;
  timeval *in_R9;
  int del;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  iVar2 = Fl::compose((int *)((long)&uStack_18 + 4));
  if (iVar2 == 0) {
    uVar4 = Fl::e_state & 0x4d0000;
    for (pKVar5 = global_key_bindings; pKVar5 != (Key_Binding *)0x0; pKVar5 = pKVar5->next) {
      if ((pKVar5->key == Fl::e_keysym) &&
         ((pKVar5->state == 0xffffffff || (pKVar5->state == uVar4)))) {
        p_Var6 = pKVar5->function;
        if (p_Var6 != (Key_Func)0x0) goto LAB_001d6db7;
        break;
      }
    }
    for (pKVar5 = this->key_bindings; pKVar5 != (Key_Binding *)0x0; pKVar5 = pKVar5->next) {
      if ((pKVar5->key == Fl::e_keysym) &&
         ((pKVar5->state == 0xffffffff || (pKVar5->state == uVar4)))) {
        p_Var6 = pKVar5->function;
        if (p_Var6 != (Key_Func)0x0) {
LAB_001d6db7:
          iVar2 = (*p_Var6)(Fl::e_keysym,this);
          return iVar2;
        }
        break;
      }
    }
    iVar2 = 0;
    if (uVar4 == 0 && this->default_key_function_ != (Key_Func)0x0) {
      iVar2 = (*this->default_key_function_)((int)*Fl::e_text,this);
    }
  }
  else {
    if (uStack_18._4_4_ != 0) {
      uVar4 = (this->super_Fl_Text_Display).mCursorPos;
      uVar3 = uVar4 - uStack_18._4_4_;
      __nfds = 0;
      if (0 < (int)uVar3) {
        __nfds = uVar3;
      }
      Fl_Text_Buffer::select
                ((this->super_Fl_Text_Display).mBuffer,__nfds,(fd_set *)(ulong)uVar4,
                 (fd_set *)(ulong)uVar3,in_R8,in_R9);
    }
    kill_selection(this);
    if (Fl::e_length != 0) {
      if (this->insert_mode_ == 0) {
        Fl_Text_Display::overstrike(&this->super_Fl_Text_Display,Fl::e_text);
      }
      else {
        Fl_Text_Display::insert(&this->super_Fl_Text_Display,Fl::e_text);
      }
    }
    Fl_Text_Display::show_insert_position(&this->super_Fl_Text_Display);
    puVar1 = &(this->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    iVar2 = 1;
    if (((this->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.when_ & 1) != 0) {
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.user_data_);
    }
  }
  return iVar2;
}

Assistant:

int Fl_Text_Editor::handle_key() {
  // Call FLTK's rules to try to turn this into a printing character.
  // This uses the right-hand ctrl key as a "compose prefix" and returns
  // the changes that should be made to the text, as a number of
  // bytes to delete and a string to insert:
  int del = 0;
  if (Fl::compose(del)) {
    if (del) {
      // del is a number of bytes
      int dp = insert_position() - del;
      if ( dp < 0 ) dp = 0;
      buffer()->select(dp, insert_position());
    }
    kill_selection(this);
    if (Fl::event_length()) {
      if (insert_mode()) insert(Fl::event_text());
      else overstrike(Fl::event_text());
    }
#ifdef __APPLE__
    if (Fl::compose_state) {
      int pos = this->insert_position();
      this->buffer()->select(pos - Fl::compose_state, pos);
      }
#endif
    show_insert_position();
    set_changed();
    if (when()&FL_WHEN_CHANGED) do_callback();
    return 1;
  }

  int key = Fl::event_key(), state = Fl::event_state(), c = Fl::event_text()[0];
  state &= FL_SHIFT|FL_CTRL|FL_ALT|FL_META; // only care about these states
  Key_Func f;
  f = bound_key_function(key, state, global_key_bindings);
  if (!f) f = bound_key_function(key, state, key_bindings);
  if (f) return f(key, this);
  if (default_key_function_ && !state) return default_key_function_(c, this);
  return 0;
}